

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall ThreadPool::start(ThreadPool *this)

{
  enable_shared_from_this<ThreadPool> local_30;
  thread local_20;
  uint local_14;
  ThreadPool *pTStack_10;
  int i;
  ThreadPool *this_local;
  
  this->m_isRunning = true;
  pTStack_10 = this;
  for (local_14 = 0; local_14 < this->m_threadnum; local_14 = local_14 + 1) {
    std::enable_shared_from_this<ThreadPool>::shared_from_this(&local_30);
    std::thread::
    thread<std::shared_ptr<ThreadPool>(&)(std::shared_ptr<ThreadPool>),std::shared_ptr<ThreadPool>,void>
              (&local_20,threadfun,(shared_ptr<ThreadPool> *)&local_30);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back(&this->m_threads,&local_20);
    std::thread::~thread(&local_20);
    std::shared_ptr<ThreadPool>::~shared_ptr((shared_ptr<ThreadPool> *)&local_30);
  }
  return;
}

Assistant:

void ThreadPool::start()
{
	m_isRunning=true;
	for (int i = 0; i < m_threadnum; i++) {	
		m_threads.push_back(std::thread(threadfun,shared_from_this()));
		
	}
}